

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::LimitingInputStream::BackUp(LimitingInputStream *this,int count)

{
  int count_local;
  LimitingInputStream *this_local;
  
  if (this->limit_ < 0) {
    (*this->input_->_vptr_ZeroCopyInputStream[3])
              (this->input_,(ulong)(uint)(count - (int)this->limit_));
    this->limit_ = (long)count;
  }
  else {
    (*this->input_->_vptr_ZeroCopyInputStream[3])(this->input_,(ulong)(uint)count);
    this->limit_ = (long)count + this->limit_;
  }
  return;
}

Assistant:

void LimitingInputStream::BackUp(int count) {
  if (limit_ < 0) {
    input_->BackUp(count - limit_);
    limit_ = count;
  } else {
    input_->BackUp(count);
    limit_ += count;
  }
}